

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathIdFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr pxVar1;
  xmlNodeSetPtr pxVar2;
  xmlXPathObjectPtr value;
  xmlChar *ids;
  xmlNodeSetPtr pxVar3;
  int error;
  long lVar4;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueFrame < ctxt->valueNr) {
      pxVar1 = valuePop(ctxt);
      if (pxVar1 != (xmlXPathObjectPtr)0x0) {
        if ((pxVar1->type | XPATH_USERS) == XPATH_XSLT_TREE) {
          pxVar2 = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
          if (pxVar2 == (xmlNodeSetPtr)0x0) {
            pxVar2 = (xmlNodeSetPtr)0x0;
            xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating nodeset\n");
          }
          else {
            pxVar2->nodeNr = 0;
            pxVar2->nodeMax = 0;
            pxVar2->nodeTab = (xmlNodePtr *)0x0;
          }
          if ((pxVar1->nodesetval != (xmlNodeSetPtr)0x0) &&
             (pxVar3 = pxVar1->nodesetval, 0 < pxVar3->nodeNr)) {
            lVar4 = 0;
            do {
              ids = xmlNodeGetContent(pxVar3->nodeTab[lVar4]);
              if (ids == (xmlChar *)0x0) {
                ids = xmlStrdup("");
              }
              pxVar3 = xmlXPathGetElementsByIds(ctxt->context->doc,ids);
              pxVar2 = xmlXPathNodeSetMerge(pxVar2,pxVar3);
              xmlXPathFreeNodeSet(pxVar3);
              if (ids != (xmlChar *)0x0) {
                (*xmlFree)(ids);
              }
              lVar4 = lVar4 + 1;
              pxVar3 = pxVar1->nodesetval;
            } while (lVar4 < pxVar3->nodeNr);
          }
          xmlXPathReleaseObject(ctxt->context,pxVar1);
          pxVar1 = xmlXPathCacheWrapNodeSet(ctxt->context,pxVar2);
          valuePush(ctxt,pxVar1);
          return;
        }
        pxVar1 = xmlXPathCacheConvertString(ctxt->context,pxVar1);
        if (pxVar1 == (xmlXPathObjectPtr)0x0) {
          return;
        }
        pxVar2 = xmlXPathGetElementsByIds(ctxt->context->doc,pxVar1->stringval);
        value = xmlXPathCacheWrapNodeSet(ctxt->context,pxVar2);
        valuePush(ctxt,value);
        xmlXPathReleaseObject(ctxt->context,pxVar1);
        return;
      }
      error = 10;
    }
    else {
      error = 0x17;
    }
  }
  else {
    error = 0xc;
  }
  xmlXPathErr(ctxt,error);
  return;
}

Assistant:

void
xmlXPathIdFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlChar *tokens;
    xmlNodeSetPtr ret;
    xmlXPathObjectPtr obj;

    CHECK_ARITY(1);
    obj = valuePop(ctxt);
    if (obj == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    if ((obj->type == XPATH_NODESET) || (obj->type == XPATH_XSLT_TREE)) {
	xmlNodeSetPtr ns;
	int i;

        /* TODO: Check memory error. */
	ret = xmlXPathNodeSetCreate(NULL);

	if (obj->nodesetval != NULL) {
	    for (i = 0; i < obj->nodesetval->nodeNr; i++) {
		tokens =
		    xmlXPathCastNodeToString(obj->nodesetval->nodeTab[i]);
		ns = xmlXPathGetElementsByIds(ctxt->context->doc, tokens);
                /* TODO: Check memory error. */
		ret = xmlXPathNodeSetMerge(ret, ns);
		xmlXPathFreeNodeSet(ns);
		if (tokens != NULL)
		    xmlFree(tokens);
	    }
	}
	xmlXPathReleaseObject(ctxt->context, obj);
	valuePush(ctxt, xmlXPathCacheWrapNodeSet(ctxt->context, ret));
	return;
    }
    obj = xmlXPathCacheConvertString(ctxt->context, obj);
    if (obj == NULL) return;
    ret = xmlXPathGetElementsByIds(ctxt->context->doc, obj->stringval);
    valuePush(ctxt, xmlXPathCacheWrapNodeSet(ctxt->context, ret));
    xmlXPathReleaseObject(ctxt->context, obj);
    return;
}